

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

void __thiscall Component_construct_Test::~Component_construct_Test(Component_construct_Test *this)

{
  Component_construct_Test *this_local;
  
  ~Component_construct_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Component, construct)
{
    const std::string validName = "valid_name";

    libcellml::ComponentPtr c1 = libcellml::Component::create();
    c1->setName(validName);

    EXPECT_EQ("valid_name", c1->name());

    auto c2 = libcellml::Component::create(validName);
    EXPECT_EQ("valid_name", c2->name());
}